

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall Pathie::GlobError::GlobError(GlobError *this,int val)

{
  string *psVar1;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  PathieError::PathieError(&this->super_PathieError);
  *(undefined ***)&this->super_PathieError = &PTR__GlobError_00114c20;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,val);
  this->m_val = val;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1e0,"Glob error code ",&local_200);
  std::operator+(&local_1c0,&local_1e0,": ");
  psVar1 = &(this->super_PathieError).m_pathie_errmsg;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

GlobError::GlobError(int val)
{
  std::stringstream ss;
  ss << val;

  m_val = val;

  m_pathie_errmsg = "Glob error code " + ss.str() + ": ";

  switch(val) {
  case GLOB_NOSPACE:
    m_pathie_errmsg += "GLOB_NOSPACE";
    break;
  case GLOB_ABORTED:
    m_pathie_errmsg += "GLOB_ABORTED";
    break;
  case GLOB_NOMATCH:
    m_pathie_errmsg += "GLOB_NOMATCH";
    break;
  default:
    m_pathie_errmsg += "Unknown glob error";
    break;
  }
}